

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastReduceMatrix2(Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Int_t *vRes,int fSigned,int fCla)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  int NodeC;
  int NodeS;
  int local_70;
  int local_6c;
  ulong local_68;
  ulong local_60;
  Vec_Wec_t *local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  iVar7 = Wlc_BlastAddLevel(pNew,0);
  iVar1 = vProds->nSize;
  lVar12 = (long)iVar1;
  if (0 < lVar12) {
    lVar13 = 8;
    lVar16 = 0;
    do {
      Wlc_IntSortCostReverse
                (pNew,*(int **)((long)&vProds->pArray->nCap + lVar13),
                 *(int *)((long)vProds->pArray + lVar13 + -4));
      lVar16 = lVar16 + 1;
      lVar8 = (long)vProds->nSize;
      lVar13 = lVar13 + 0x10;
    } while (lVar16 < lVar8);
    if (0 < iVar1) {
      lVar13 = 0;
      local_58 = vProds;
      do {
        if ((int)lVar8 <= lVar13) goto LAB_008b108e;
        iVar11 = vProds->pArray[lVar13].nSize;
        lVar16 = lVar13 + 1;
        if (2 < iVar11) {
          pVVar9 = vProds->pArray + lVar13;
          local_50 = lVar13 * 0x10;
          local_48 = lVar13;
          local_40 = lVar13 + 1;
          do {
            piVar10 = pVVar9->pArray;
            pVVar9->nSize = iVar11 - 1U;
            uVar2 = piVar10[iVar11 - 1U];
            pVVar9->nSize = iVar11 - 2U;
            uVar3 = piVar10[iVar11 - 2U];
            pVVar9->nSize = iVar11 - 3U;
            uVar4 = piVar10[iVar11 - 3U];
            if ((int)uVar4 < 0) {
LAB_008b106f:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar15 = uVar4 >> 1;
            pVVar5 = pNew->vLevels;
            local_68 = (ulong)uVar2;
            local_60 = (ulong)uVar3;
            local_38 = (ulong)uVar4;
            Vec_IntFillExtra(pVVar5,uVar15 + 1,0);
            if (pVVar5->nSize <= (int)uVar15) goto LAB_008b1050;
            if ((int)local_60 < 0) goto LAB_008b106f;
            iVar11 = pVVar5->pArray[uVar15];
            uVar14 = local_60 >> 1 & 0x7fffffff;
            pVVar5 = pNew->vLevels;
            iVar6 = (int)uVar14;
            Vec_IntFillExtra(pVVar5,iVar6 + 1,0);
            if (pVVar5->nSize <= iVar6) goto LAB_008b1050;
            if (iVar11 < pVVar5->pArray[uVar14]) {
              __assert_fail("Gia_ObjLevelId(pNew, Abc_Lit2Var(Node3)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                            ,0x3d7,
                            "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                           );
            }
            pVVar5 = pNew->vLevels;
            Vec_IntFillExtra(pVVar5,iVar6 + 1,0);
            if (pVVar5->nSize <= iVar6) goto LAB_008b1050;
            if ((int)local_68 < 0) goto LAB_008b106f;
            iVar11 = pVVar5->pArray[uVar14];
            uVar14 = local_68 >> 1 & 0x7fffffff;
            pVVar5 = pNew->vLevels;
            iVar6 = (int)uVar14;
            Vec_IntFillExtra(pVVar5,iVar6 + 1,0);
            if (pVVar5->nSize <= iVar6) goto LAB_008b1050;
            if (iVar11 < pVVar5->pArray[uVar14]) {
              __assert_fail("Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node1))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                            ,0x3d8,
                            "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                           );
            }
            Wlc_BlastFullAdder(pNew,(int)local_68,(int)local_60,(int)local_38,&local_70,&local_6c);
            iVar7 = Wlc_BlastAddLevel(pNew,iVar7);
            Wlc_IntInsert2(pNew,pVVar9,local_6c);
            lVar16 = local_40;
            vProds = local_58;
            if (local_58->nSize <= local_40) goto LAB_008b108e;
            Wlc_IntInsert2(pNew,local_58->pArray + local_40,local_70);
            lVar8 = (long)vProds->nSize;
            if (lVar8 <= local_48) goto LAB_008b108e;
            iVar11 = *(int *)((long)&vProds->pArray->nSize + local_50);
            pVVar9 = (Vec_Int_t *)((long)&vProds->pArray->nCap + local_50);
          } while (2 < iVar11);
        }
        lVar13 = lVar16;
      } while (lVar13 != lVar12);
      if (0 < iVar1) {
        lVar13 = 0;
        do {
          if (vProds->nSize <= lVar13) goto LAB_008b108e;
          iVar7 = vProds->pArray[lVar13].nSize;
          if (iVar7 < 2) {
            pVVar9 = vProds->pArray + lVar13;
            do {
              Vec_IntPush(pVVar9,0);
              iVar7 = pVVar9->nSize;
            } while (iVar7 < 2);
          }
          if (iVar7 != 2) {
            __assert_fail("Vec_IntSize(vProd) == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                          ,0x3ea,
                          "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                         );
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar12);
      }
    }
  }
  vRes->nSize = 0;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar9->pArray = piVar10;
  if (0 < iVar1) {
    lVar13 = 8;
    lVar16 = 0;
    do {
      if (vProds->nSize <= lVar16) {
LAB_008b108e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = vProds->pArray;
      if (*(int *)((long)pVVar5 + lVar13 + -4) < 1) {
LAB_008b1050:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(vRes,**(int **)((long)&pVVar5->nCap + lVar13));
      if (*(int *)((long)pVVar5 + lVar13 + -4) < 2) goto LAB_008b1050;
      Vec_IntPush(pVVar9,*(int *)(*(long *)((long)&pVVar5->nCap + lVar13) + 4));
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar12 != lVar16);
  }
  Vec_IntPush(vRes,0);
  Vec_IntPush(pVVar9,0);
  piVar10 = pVVar9->pArray;
  if (fCla == 0) {
    Wlc_BlastAdder(pNew,vRes->pArray,piVar10,vRes->nSize,0);
  }
  else {
    Wlc_BlastAdderCLA(pNew,vRes->pArray,piVar10,vRes->nSize,fSigned,0);
  }
  if (piVar10 != (int *)0x0) {
    free(piVar10);
  }
  free(pVVar9);
  return;
}

Assistant:

void Wlc_BlastReduceMatrix2( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Int_t * vProd, * vTemp;
    int i, NodeS, NodeC, Node1, Node2, Node3;
    int Start = Wlc_BlastAddLevel( pNew, 0 );
    int nSize = Vec_WecSize(vProds);
    Vec_WecForEachLevel( vProds, vProd, i )
        Wlc_IntSortCostReverse( pNew, Vec_IntArray(vProd), Vec_IntSize(vProd) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            assert( Gia_ObjLevelId(pNew, Abc_Lit2Var(Node3)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) );
            assert( Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node1)) );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            Start = Wlc_BlastAddLevel( pNew, Start );

            Wlc_IntInsert2( pNew, vProd, NodeS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            Wlc_IntInsert2( pNew, vProd, NodeC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }
//    Vec_WecPrint( vProds, 0 );

    Vec_IntClear( vRes );
    vTemp = Vec_IntAlloc( 100 );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,  Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vTemp, Vec_IntEntry(vProd, 1) );
    }
    Vec_IntPush( vRes,  0 );
    Vec_IntPush( vTemp, 0 );

    if ( fCla )
        Wlc_BlastAdderCLA( pNew, Vec_IntArray(vRes), Vec_IntArray(vTemp), Vec_IntSize(vRes), fSigned, 0 );
    else
        Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vTemp), Vec_IntSize(vRes), 0 );
    Vec_IntFree( vTemp );
}